

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::DetermineHasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  size_type sVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  ImportInfo *pIVar5;
  cmValue __lhs;
  long lVar6;
  cmake *this_01;
  char *pcVar7;
  string_view str;
  undefined1 local_1d0 [16];
  string local_1c0;
  string install_name;
  
  bVar2 = IsImported(this);
  if (bVar2) {
    pIVar5 = GetImportInfo(this,config);
    if (pIVar5 == (ImportInfo *)0x0) {
      return false;
    }
    if ((pIVar5->NoSOName != false) || (sVar1 = (pIVar5->SOName)._M_string_length, sVar1 == 0)) {
      install_name._M_dataplus._M_p = (pointer)&install_name.field_2;
      install_name._M_string_length = 0;
      install_name.field_2._M_local_buf[0] = '\0';
      cmSystemTools::GuessLibraryInstallName(&pIVar5->Location,&install_name);
      bVar2 = false;
      lVar6 = std::__cxx11::string::find((char *)&install_name,0x66db3b);
      std::__cxx11::string::~string((string *)&install_name);
      if (lVar6 == -1) {
        return false;
      }
      goto LAB_00339163;
    }
    str._M_str = (pIVar5->SOName)._M_dataplus._M_p;
    str._M_len = sVar1;
    bVar3 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"@rpath/");
  }
  else {
    TVar4 = GetType(this);
    if (TVar4 != SHARED_LIBRARY) {
      return false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&install_name,"INSTALL_NAME_DIR",(allocator<char> *)(local_1d0 + 0x10));
    __lhs = GetProperty(this,&install_name);
    std::__cxx11::string::~string((string *)&install_name);
    bVar2 = MacOSXUseInstallNameDir(this);
    if (__lhs.Value == (string *)0x0 || !bVar2) {
      bVar2 = MacOSXRpathInstallNameDirDefault(this);
      if (!bVar2) {
        return false;
      }
      goto LAB_00339163;
    }
    bVar3 = std::operator==(__lhs.Value,"@rpath");
  }
  bVar2 = false;
  if (bVar3 == false) {
    return false;
  }
LAB_00339163:
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&install_name,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG",
             (allocator<char> *)(local_1d0 + 0x10));
  bVar3 = cmMakefile::IsSet(this_00,&install_name);
  std::__cxx11::string::~string((string *)&install_name);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&install_name);
    std::operator<<((ostream *)&install_name,"Attempting to use ");
    pcVar7 = "@rpath";
    if (bVar2 != false) {
      pcVar7 = "MACOSX_RPATH";
    }
    std::operator<<((ostream *)&install_name,pcVar7);
    std::operator<<((ostream *)&install_name,
                    " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.");
    std::operator<<((ostream *)&install_name,
                    "  This could be because you are using a Mac OS X version");
    std::operator<<((ostream *)&install_name,
                    " less than 10.5 or because CMake\'s platform configuration is");
    std::operator<<((ostream *)&install_name," corrupt.");
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)local_1d0);
    cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1d0 + 0x10),
                        (cmListFileBacktrace *)local_1d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
    std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&install_name);
    return true;
  }
  return true;
}

Assistant:

bool cmGeneratorTarget::DetermineHasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    cmValue install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name && *install_name == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (cmHasLiteralPrefix(info->SOName, "@rpath/")) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}